

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::EscapeOperator>>
               (string_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Vector *vector;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  string_t sVar12;
  idx_t local_60;
  Vector *vector_1;
  anon_union_16_2_67f50693_for_value local_48;
  ulong local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    local_60 = count;
    while (bVar11 = local_60 != 0, local_60 = local_60 - 1, bVar11) {
      puVar1 = (undefined8 *)((long)ldata + lVar5 + -8);
      local_48._0_8_ = *puVar1;
      local_48.pointer.ptr = (char *)puVar1[1];
      sVar12 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                         ((string_t *)&local_48.pointer,(Vector *)dataptr);
      *(long *)((long)result_data + lVar5 + -8) = sVar12.value._0_8_;
      *(long *)((long)&result_data->value + lVar5) = sVar12.value._8_8_;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    local_38 = count + 0x3f >> 6;
    uVar9 = 0;
    for (uVar4 = 0; uVar4 != local_38; uVar4 = uVar4 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
LAB_00834d44:
        uVar6 = uVar9 << 4 | 8;
        for (; uVar3 = uVar9, uVar9 < uVar10; uVar9 = uVar9 + 1) {
          puVar1 = (undefined8 *)((long)ldata + (uVar6 - 8));
          local_48._0_8_ = *puVar1;
          local_48.pointer.ptr = (char *)puVar1[1];
          sVar12 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                             ((string_t *)&local_48.pointer,(Vector *)dataptr);
          *(long *)((long)result_data + (uVar6 - 8)) = sVar12.value._0_8_;
          *(long *)((long)&result_data->value + uVar6) = sVar12.value._8_8_;
          uVar6 = uVar6 + 0x10;
        }
      }
      else {
        uVar6 = puVar2[uVar4];
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_00834d44;
        uVar3 = uVar10;
        if (uVar6 != 0) {
          uVar8 = uVar9 << 4 | 8;
          for (uVar7 = 0; uVar3 = uVar7 + uVar9, uVar7 + uVar9 < uVar10; uVar7 = uVar7 + 1) {
            if ((uVar6 >> (uVar7 & 0x3f) & 1) != 0) {
              puVar1 = (undefined8 *)((long)ldata + (uVar8 - 8));
              local_48._0_8_ = *puVar1;
              local_48.pointer.ptr = (char *)puVar1[1];
              sVar12 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                                 ((string_t *)&local_48.pointer,(Vector *)dataptr);
              *(long *)((long)result_data + (uVar8 - 8)) = sVar12.value._0_8_;
              *(long *)((long)&result_data->value + uVar8) = sVar12.value._8_8_;
            }
            uVar8 = uVar8 + 0x10;
          }
        }
      }
      uVar9 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}